

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_const_char_*>,_const_char_(&)[36]>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QLatin1String,_const_char_*>,_const_char_(&)[36]> *this)

{
  char *pcVar1;
  QChar *pQVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  iterator d;
  QChar *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = (this->a).a.m_size;
  pcVar1 = (this->a).b;
  if (pcVar1 == (char *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar4 = strlen(pcVar1);
  }
  lVar7 = lVar6 + sVar4 + 0x23;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  lVar6 = 0;
  QString::QString(__return_storage_ptr__,lVar7,Uninitialized);
  pQVar2 = (QChar *)(__return_storage_ptr__->d).ptr;
  lVar5 = (this->a).a.m_size;
  local_40 = pQVar2;
  QAbstractConcatenable::appendLatin1To((this->a).a,pQVar2);
  local_40 = local_40 + lVar5;
  pcVar1 = (this->a).b;
  if (pcVar1 != (char *)0x0) {
    lVar5 = -1;
    do {
      lVar6 = lVar5 + 1;
      lVar3 = lVar5 + 1;
      lVar5 = lVar6;
    } while (pcVar1[lVar3] != '\0');
  }
  QVar8.m_data = pcVar1;
  QVar8.m_size = lVar6;
  QAbstractConcatenable::convertFromUtf8(QVar8,&local_40);
  QVar9.m_data = *this->b;
  QVar9.m_size = 0x23;
  QAbstractConcatenable::convertFromUtf8(QVar9,&local_40);
  if (lVar7 != (long)local_40 - (long)pQVar2 >> 1) {
    QString::resize((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }